

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

QByteArray * QUtf32::convertFromUnicode(QStringView in,State *state,DataEndianness endian)

{
  QStringView in_00;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  long in_RCX;
  __off_t __length;
  storage_type_conflict *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  char *end;
  qsizetype length;
  bool writeBom;
  QByteArray *ba;
  Flag in_stack_ffffffffffffff5c;
  QByteArray *in_stack_ffffffffffffff60;
  QByteArray *size;
  uint3 in_stack_ffffffffffffff88;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  QByteArray *pQVar5;
  QFlagsStorageHelper<QStringConverterBase::Flag,_4> local_1c;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (uint)in_stack_ffffffffffffff88;
  size = in_RDI;
  pQVar5 = in_RDI;
  local_18.m_size = (qsizetype)in_RSI;
  if ((*(uint *)(in_RCX + 4) & 1) == 0) {
    local_1c.super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorage<QStringConverterBase::Flag>)
         QFlags<QStringConverterBase::Flag>::operator&
                   ((QFlags<QStringConverterBase::Flag> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_1c);
    uVar4 = CONCAT13(bVar1,(int3)uVar4);
  }
  QStringView::size(&local_18);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray
            ((QByteArray *)CONCAT44(in_stack_ffffffffffffff8c,uVar4),(qsizetype)size,
             (Initialization)((ulong)in_RDI >> 0x20));
  QByteArray::data(in_stack_ffffffffffffff60);
  in_00.m_data = (storage_type_conflict *)local_18.m_size;
  in_00.m_size = (qsizetype)pQVar5;
  pcVar2 = convertFromUnicode(in_stack_ffffffffffffff90,in_00,
                              (State *)CONCAT44(in_stack_ffffffffffffff8c,uVar4),
                              (DataEndianness)((ulong)size >> 0x20));
  pcVar3 = QByteArray::constData((QByteArray *)0x543219);
  QByteArray::truncate(in_RDI,pcVar2 + -(long)pcVar3,__length);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return size;
}

Assistant:

QByteArray QUtf32::convertFromUnicode(QStringView in, QStringConverter::State *state, DataEndianness endian)
{
    bool writeBom = !(state->internalState & HeaderDone) && state->flags & QStringConverter::Flag::WriteBom;
    qsizetype length =  4*in.size();
    if (writeBom)
        length += 4;
    QByteArray ba(length, Qt::Uninitialized);
    char *end = convertFromUnicode(ba.data(), in, state, endian);
    ba.truncate(end - ba.constData());
    return ba;
}